

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

int yaml_emitter_initialize(yaml_emitter_t *emitter)

{
  yaml_char_t *__ptr;
  uchar *__ptr_00;
  yaml_emitter_state_t *__ptr_01;
  yaml_event_t *__ptr_02;
  int *__ptr_03;
  yaml_tag_directive_t *pyVar1;
  
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x165,"int yaml_emitter_initialize(yaml_emitter_t *)");
  }
  memset(emitter,0,0x1b0);
  __ptr = (yaml_char_t *)malloc(0x4000);
  (emitter->buffer).start = __ptr;
  if (__ptr != (yaml_char_t *)0x0) {
    (emitter->buffer).pointer = __ptr;
    (emitter->buffer).last = __ptr;
    (emitter->buffer).end = __ptr + 0x4000;
    __ptr_00 = (uchar *)malloc(0x8002);
    (emitter->raw_buffer).start = __ptr_00;
    if (__ptr_00 != (uchar *)0x0) {
      (emitter->raw_buffer).pointer = __ptr_00;
      (emitter->raw_buffer).last = __ptr_00;
      (emitter->raw_buffer).end = __ptr_00 + 0x8002;
      __ptr_01 = (yaml_emitter_state_t *)malloc(0x40);
      (emitter->states).start = __ptr_01;
      if (__ptr_01 == (yaml_emitter_state_t *)0x0) {
        __ptr_03 = (int *)0x0;
        __ptr_02 = (yaml_event_t *)0x0;
        __ptr_01 = (yaml_emitter_state_t *)0x0;
      }
      else {
        (emitter->states).top = __ptr_01;
        (emitter->states).end = __ptr_01 + 0x10;
        __ptr_02 = (yaml_event_t *)malloc(0x680);
        (emitter->events).start = __ptr_02;
        if (__ptr_02 == (yaml_event_t *)0x0) {
          __ptr_03 = (int *)0x0;
          __ptr_02 = (yaml_event_t *)0x0;
        }
        else {
          (emitter->events).tail = __ptr_02;
          (emitter->events).head = __ptr_02;
          (emitter->events).end = __ptr_02 + 0x10;
          __ptr_03 = (int *)malloc(0x40);
          (emitter->indents).start = __ptr_03;
          if (__ptr_03 == (int *)0x0) {
            __ptr_03 = (int *)0x0;
          }
          else {
            (emitter->indents).top = __ptr_03;
            (emitter->indents).end = __ptr_03 + 0x10;
            pyVar1 = (yaml_tag_directive_t *)malloc(0x100);
            (emitter->tag_directives).start = pyVar1;
            if (pyVar1 != (yaml_tag_directive_t *)0x0) {
              (emitter->tag_directives).top = pyVar1;
              (emitter->tag_directives).end = pyVar1 + 0x10;
              return 1;
            }
          }
        }
      }
      goto LAB_00190783;
    }
  }
  __ptr_03 = (int *)0x0;
  __ptr_02 = (yaml_event_t *)0x0;
  __ptr_01 = (yaml_emitter_state_t *)0x0;
  __ptr_00 = (uchar *)0x0;
LAB_00190783:
  emitter->error = YAML_MEMORY_ERROR;
  free(__ptr);
  (emitter->buffer).start = (yaml_char_t *)0x0;
  (emitter->buffer).end = (yaml_char_t *)0x0;
  (emitter->buffer).pointer = (yaml_char_t *)0x0;
  free(__ptr_00);
  (emitter->raw_buffer).start = (uchar *)0x0;
  (emitter->raw_buffer).end = (uchar *)0x0;
  (emitter->raw_buffer).pointer = (uchar *)0x0;
  free(__ptr_01);
  (emitter->states).start = (yaml_emitter_state_t *)0x0;
  (emitter->states).end = (yaml_emitter_state_t *)0x0;
  (emitter->states).top = (yaml_emitter_state_t *)0x0;
  free(__ptr_02);
  (emitter->events).head = (yaml_event_t *)0x0;
  (emitter->events).tail = (yaml_event_t *)0x0;
  (emitter->events).start = (yaml_event_t *)0x0;
  (emitter->events).end = (yaml_event_t *)0x0;
  free(__ptr_03);
  (emitter->tag_directives).end = (yaml_tag_directive_t *)0x0;
  (emitter->tag_directives).top = (yaml_tag_directive_t *)0x0;
  (emitter->indents).top = (int *)0x0;
  (emitter->tag_directives).start = (yaml_tag_directive_t *)0x0;
  (emitter->indents).start = (int *)0x0;
  (emitter->indents).end = (int *)0x0;
  return 0;
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_initialize(yaml_emitter_t *emitter)
{
    assert(emitter);    /* Non-NULL emitter object expected. */

    memset(emitter, 0, sizeof(yaml_emitter_t));
    if (!BUFFER_INIT(emitter, emitter->buffer, OUTPUT_BUFFER_SIZE))
        goto error;
    if (!BUFFER_INIT(emitter, emitter->raw_buffer, OUTPUT_RAW_BUFFER_SIZE))
        goto error;
    if (!STACK_INIT(emitter, emitter->states, yaml_emitter_state_t*))
        goto error;
    if (!QUEUE_INIT(emitter, emitter->events, INITIAL_QUEUE_SIZE, yaml_event_t*))
        goto error;
    if (!STACK_INIT(emitter, emitter->indents, int*))
        goto error;
    if (!STACK_INIT(emitter, emitter->tag_directives, yaml_tag_directive_t*))
        goto error;

    return 1;

error:

    BUFFER_DEL(emitter, emitter->buffer);
    BUFFER_DEL(emitter, emitter->raw_buffer);
    STACK_DEL(emitter, emitter->states);
    QUEUE_DEL(emitter, emitter->events);
    STACK_DEL(emitter, emitter->indents);
    STACK_DEL(emitter, emitter->tag_directives);

    return 0;
}